

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Crop_x86_avx::forward(Crop_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  _func_int *p_Var1;
  Mat *pMVar2;
  int iVar3;
  ulong uVar4;
  sbyte sVar5;
  int z;
  int iVar6;
  int q;
  uint uVar7;
  uint uVar8;
  int *_doffset_00;
  void *__arg;
  undefined4 uVar9;
  bool bVar10;
  int _outw;
  int _outh;
  undefined8 local_190;
  int local_184;
  int local_180;
  int _woffset;
  int _outc;
  int _outd;
  int _hoffset;
  int local_16c;
  int local_168;
  int _coffset;
  Mat *local_160;
  int local_158;
  int _doffset;
  Mat bottom_blob_unpacked;
  Mat m;
  Mat borderm;
  Mat local_78;
  
  iVar3 = bottom_blob->dims;
  uVar4 = bottom_blob->elemsize;
  iVar6 = bottom_blob->elempack;
  local_190 = this;
  if (iVar6 != 4) {
    if (iVar6 != 8) goto switchD_001ab8bb_default;
    p_Var1 = this->_vptr_Crop_x86_avx[-3];
    local_184 = bottom_blob->w;
    local_180 = bottom_blob->h;
    local_16c = bottom_blob->c;
    local_168 = bottom_blob->d;
    local_160 = top_blob;
    local_158 = iVar6;
    Mat::shape(&bottom_blob_unpacked,bottom_blob);
    _doffset_00 = &_doffset;
    Crop::resolve_crop_roi
              ((Crop *)((long)&this->_vptr_Crop_x86_avx + (long)p_Var1),&bottom_blob_unpacked,
               &_woffset,&_hoffset,_doffset_00,&_coffset,&_outw,&_outh,&_outd,&_outc);
    Mat::~Mat(&bottom_blob_unpacked);
    pMVar2 = local_160;
    top_blob = local_160;
    iVar6 = local_158;
    switch(iVar3) {
    case 1:
      uVar8 = _outw & 7;
      bVar10 = (_outw & 3U) == 0;
      iVar3 = (uint)bVar10 * 3 + 1;
      if (uVar8 == 0) {
        iVar3 = 8;
      }
      sVar5 = bVar10 * '\x02';
      if (uVar8 == 0) {
        sVar5 = 3;
      }
      if (local_184 != _outw / iVar3 || uVar8 != 0) {
        if (((_outw | _woffset) & 7U) == 0) {
          Mat::create(local_160,_outw / iVar3,(uVar4 >> 3) << sVar5,8,opt->blob_allocator);
          local_190 = (Crop_x86_avx *)CONCAT44(local_190._4_4_,0xffffff9c);
          if ((pMVar2->data != (void *)0x0) && ((long)pMVar2->c * pMVar2->cstep != 0)) {
            local_190 = (Crop_x86_avx *)((ulong)local_190._4_4_ << 0x20);
            crop_pack8_avx(bottom_blob,pMVar2,0,_woffset / 8);
          }
          goto LAB_001ac4e7;
        }
        goto switchD_001ab8bb_default;
      }
      goto LAB_001abc9d;
    case 2:
      sVar5 = ((_outh & 3U) == 0) * '\x02';
      if ((_outh & 7U) == 0) {
        sVar5 = 3;
      }
      if (_outw == local_184) {
        iVar3 = (uint)((_outh & 3U) == 0) * 3 + 1;
        if ((_outh & 7U) == 0) {
          iVar3 = 8;
        }
        if (((_outh & 7U) == 0) && (_outh / iVar3 == local_180)) goto LAB_001abc9d;
      }
      if (((_hoffset | _outh) & 7U) != 0) goto switchD_001ab8bb_default;
      Mat::create(local_160,_outw,_outh / 8,(uVar4 >> 3) << sVar5,8,opt->blob_allocator);
      local_190 = (Crop_x86_avx *)CONCAT44(local_190._4_4_,0xffffff9c);
      if ((pMVar2->data == (void *)0x0) || ((long)pMVar2->c * pMVar2->cstep == 0))
      goto LAB_001ac4e7;
      crop_pack8_avx(bottom_blob,pMVar2,_hoffset / 8,_woffset);
      break;
    case 3:
      sVar5 = ((_outc & 3U) == 0) * '\x02';
      if ((_outc & 7U) == 0) {
        sVar5 = 3;
      }
      if ((_outw == local_184) && (_outh == local_180)) {
        iVar3 = (uint)((_outc & 3U) == 0) * 3 + 1;
        if ((_outc & 7U) == 0) {
          iVar3 = 8;
        }
        if (((_outc & 7U) == 0) && (_outc / iVar3 == local_16c)) goto LAB_001abc9d;
      }
      if (((_coffset | _outc) & 7U) != 0) goto switchD_001ab8bb_default;
      Mat::channel_range(&bottom_blob_unpacked,bottom_blob,_coffset / 8,_outc / 8);
      if (local_180 == _outh && local_184 == _outw) {
        Mat::clone(&m,(__fn *)&bottom_blob_unpacked,(void *)0x0,_outh,_doffset_00);
        Mat::operator=(pMVar2,&m);
        Mat::~Mat(&m);
        uVar9 = 0xffffff9c;
        if ((pMVar2->data == (void *)0x0) || ((long)pMVar2->c * pMVar2->cstep == 0))
        goto LAB_001ac38d;
      }
      Mat::create(pMVar2,_outw,_outh,_outc / 8,(uVar4 >> 3) << sVar5,8,opt->blob_allocator);
      uVar9 = 0xffffff9c;
      if ((pMVar2->data != (void *)0x0) && (uVar4 = (ulong)pMVar2->c, pMVar2->cstep * uVar4 != 0)) {
        uVar9 = 0;
        for (iVar3 = 0; iVar3 < (int)uVar4; iVar3 = iVar3 + 1) {
          Mat::channel(&m,&bottom_blob_unpacked,iVar3);
          Mat::channel(&borderm,pMVar2,iVar3);
          crop_pack8_avx(&m,&borderm,_hoffset,_woffset);
          Mat::~Mat(&borderm);
          Mat::~Mat(&m);
          uVar4 = (ulong)(uint)pMVar2->c;
        }
      }
      goto LAB_001ac38d;
    case 4:
      sVar5 = ((_outc & 3U) == 0) * '\x02';
      if ((_outc & 7U) == 0) {
        sVar5 = 3;
      }
      if (((_outw == local_184) && (_outh == local_180)) && (_outd == local_168)) {
        iVar3 = (uint)((_outc & 3U) == 0) * 3 + 1;
        if ((_outc & 7U) == 0) {
          iVar3 = 8;
        }
        if (((_outc & 7U) == 0) && (_outc / iVar3 == local_16c)) goto LAB_001abc9d;
      }
      if (((_coffset | _outc) & 7U) != 0) goto switchD_001ab8bb_default;
      local_190 = (Crop_x86_avx *)CONCAT44(local_190._4_4_,0xffffff9c);
      Mat::channel_range(&bottom_blob_unpacked,bottom_blob,_coffset / 8,_outc / 8);
      if (local_168 == _outd && (local_180 == _outh && local_184 == _outw)) {
        Mat::clone(&m,(__fn *)&bottom_blob_unpacked,(void *)0x0,_outd,(void *)(ulong)(uint)_outh);
        Mat::operator=(pMVar2,&m);
        Mat::~Mat(&m);
        if ((pMVar2->data == (void *)0x0) || ((long)pMVar2->c * pMVar2->cstep == 0))
        goto LAB_001ac4dd;
      }
      Mat::create(pMVar2,_outw,_outh,_outd,_outc / 8,(uVar4 >> 3) << sVar5,8,opt->blob_allocator);
      if ((pMVar2->data != (void *)0x0) && (uVar4 = (ulong)pMVar2->c, pMVar2->cstep * uVar4 != 0)) {
        local_190 = (Crop_x86_avx *)((ulong)local_190 & 0xffffffff00000000);
        for (iVar3 = 0; iVar3 < (int)uVar4; iVar3 = iVar3 + 1) {
          for (iVar6 = 0; iVar6 < _outd; iVar6 = iVar6 + 1) {
            Mat::channel(&borderm,&bottom_blob_unpacked,iVar3);
            Mat::depth(&m,&borderm,_doffset + iVar6);
            Mat::~Mat(&borderm);
            Mat::channel(&local_78,local_160,iVar3);
            Mat::depth(&borderm,&local_78,iVar6);
            Mat::~Mat(&local_78);
            crop_pack8_avx(&m,&borderm,_hoffset,_woffset);
            Mat::~Mat(&borderm);
            Mat::~Mat(&m);
          }
          uVar4 = (ulong)(uint)local_160->c;
        }
      }
      goto LAB_001ac4dd;
    default:
      goto switchD_001ab8bb_default;
    }
    goto LAB_001abca8;
  }
  p_Var1 = this->_vptr_Crop_x86_avx[-3];
  local_184 = bottom_blob->w;
  local_180 = bottom_blob->h;
  local_16c = bottom_blob->c;
  local_168 = bottom_blob->d;
  local_160 = top_blob;
  local_158 = iVar6;
  Mat::shape(&bottom_blob_unpacked,bottom_blob);
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86_avx + (long)p_Var1),&bottom_blob_unpacked,
             &_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,&_outc);
  Mat::~Mat(&bottom_blob_unpacked);
  pMVar2 = local_160;
  top_blob = local_160;
  iVar6 = local_158;
  if (3 < iVar3 - 1U) goto switchD_001ab8bb_default;
  uVar8 = _outc >> 2;
  switch(iVar3) {
  case 1:
    uVar8 = _outw & 7;
    bVar10 = (_outw & 3U) == 0;
    iVar3 = (uint)bVar10 * 3 + 1;
    if (uVar8 == 0) {
      iVar3 = 8;
    }
    sVar5 = bVar10 * '\x02';
    if (uVar8 == 0) {
      sVar5 = 3;
    }
    if (uVar8 != 4 || local_184 != _outw / iVar3) {
      if ((uVar8 != 4) || ((_woffset & 3U) != 0)) goto switchD_001ab8bb_default;
      Mat::create(local_160,_outw / iVar3,(uVar4 >> 2) << sVar5,4,opt->blob_allocator);
      local_190 = (Crop_x86_avx *)CONCAT44(local_190._4_4_,0xffffff9c);
      if ((pMVar2->data != (void *)0x0) && ((long)pMVar2->c * pMVar2->cstep != 0)) {
        local_190 = (Crop_x86_avx *)((ulong)local_190._4_4_ << 0x20);
        crop_pack4_sse(bottom_blob,pMVar2,0,_woffset / 4);
      }
      goto LAB_001ac4e7;
    }
LAB_001abc9d:
    Mat::operator=(local_160,bottom_blob);
    break;
  case 2:
    sVar5 = ((_outh & 3U) == 0) * '\x02';
    uVar8 = _outh & 7;
    if (uVar8 == 0) {
      sVar5 = 3;
    }
    if (_outw == local_184) {
      iVar3 = (uint)((_outh & 3U) == 0) * 3 + 1;
      if (uVar8 == 0) {
        iVar3 = 8;
      }
      if ((uVar8 == 4) && (_outh / iVar3 == local_180)) goto LAB_001abc9d;
    }
    if ((uVar8 != 4) || ((_hoffset & 3U) != 0)) {
switchD_001ab8bb_default:
      Mat::Mat(&bottom_blob_unpacked,bottom_blob);
      if (iVar6 != 1) {
        m.data = *(void **)opt;
        m.elemsize = (size_t)opt->workspace_allocator;
        m.elempack = opt->openmp_blocktime;
        m._28_1_ = opt->use_winograd_convolution;
        m._29_1_ = opt->use_sgemm_convolution;
        m._30_1_ = opt->use_int8_inference;
        m._31_1_ = opt->use_vulkan_compute;
        m.allocator = *(Allocator **)&opt->use_bf16_storage;
        m._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
        m._48_8_ = *(undefined8 *)&opt->flush_denormals;
        m._56_8_ = *(undefined8 *)&opt->use_reserved_4;
        m.refcount = (int *)opt->workspace_allocator;
        convert_packing(bottom_blob,&bottom_blob_unpacked,1,(Option *)&m);
      }
      iVar3 = Crop::forward((Crop *)((long)&local_190->_vptr_Crop_x86_avx +
                                    (long)local_190->_vptr_Crop_x86_avx[-3]),&bottom_blob_unpacked,
                            top_blob,opt);
      Mat::~Mat(&bottom_blob_unpacked);
      return iVar3;
    }
    Mat::create(local_160,_outw,_outh >> 2,(uVar4 >> 2) << sVar5,4,opt->blob_allocator);
    local_190 = (Crop_x86_avx *)CONCAT44(local_190._4_4_,0xffffff9c);
    if ((pMVar2->data == (void *)0x0) || ((long)pMVar2->c * pMVar2->cstep == 0)) goto LAB_001ac4e7;
    crop_pack4_sse(bottom_blob,pMVar2,_hoffset / 4,_woffset);
    break;
  case 3:
    sVar5 = ((_outc & 3U) == 0) * '\x02';
    uVar7 = _outc & 7;
    if (uVar7 == 0) {
      sVar5 = 3;
    }
    if ((_outw == local_184) && (_outh == local_180)) {
      iVar3 = (uint)((_outc & 3U) == 0) * 3 + 1;
      if (uVar7 == 0) {
        iVar3 = 8;
      }
      if ((uVar7 == 4) && (_outc / iVar3 == local_16c)) goto LAB_001abc9d;
    }
    if (uVar7 != 4 || (_coffset & 3U) != 0) goto switchD_001ab8bb_default;
    __arg = (void *)(ulong)uVar8;
    Mat::channel_range(&bottom_blob_unpacked,bottom_blob,_coffset >> 2,uVar8);
    if (local_180 == _outh && local_184 == _outw) {
      Mat::clone(&m,(__fn *)&bottom_blob_unpacked,(void *)0x0,_outh,__arg);
      Mat::operator=(pMVar2,&m);
      Mat::~Mat(&m);
      uVar9 = 0xffffff9c;
      if ((pMVar2->data == (void *)0x0) || ((long)pMVar2->c * pMVar2->cstep == 0))
      goto LAB_001ac38d;
    }
    Mat::create(pMVar2,_outw,_outh,_outc / 4,(uVar4 >> 2) << sVar5,4,opt->blob_allocator);
    uVar9 = 0xffffff9c;
    if ((pMVar2->data != (void *)0x0) && (uVar4 = (ulong)pMVar2->c, pMVar2->cstep * uVar4 != 0)) {
      uVar9 = 0;
      for (iVar3 = 0; iVar3 < (int)uVar4; iVar3 = iVar3 + 1) {
        Mat::channel(&m,&bottom_blob_unpacked,iVar3);
        Mat::channel(&borderm,pMVar2,iVar3);
        crop_pack4_sse(&m,&borderm,_hoffset,_woffset);
        Mat::~Mat(&borderm);
        Mat::~Mat(&m);
        uVar4 = (ulong)(uint)pMVar2->c;
      }
    }
LAB_001ac38d:
    local_190 = (Crop_x86_avx *)CONCAT44(local_190._4_4_,uVar9);
    goto LAB_001ac4dd;
  case 4:
    sVar5 = ((_outc & 3U) == 0) * '\x02';
    uVar7 = _outc & 7;
    if (uVar7 == 0) {
      sVar5 = 3;
    }
    if (((_outw == local_184) && (_outh == local_180)) && (_outd == local_168)) {
      iVar3 = (uint)((_outc & 3U) == 0) * 3 + 1;
      if (uVar7 == 0) {
        iVar3 = 8;
      }
      if ((uVar7 == 4) && (_outc / iVar3 == local_16c)) goto LAB_001abc9d;
    }
    if (uVar7 != 4 || (_coffset & 3U) != 0) goto switchD_001ab8bb_default;
    Mat::channel_range(&bottom_blob_unpacked,bottom_blob,_coffset >> 2,uVar8);
    if (local_168 == _outd && (local_180 == _outh && local_184 == _outw)) {
      Mat::clone(&m,(__fn *)&bottom_blob_unpacked,(void *)0x0,_outd,(void *)(ulong)(uint)_outh);
      Mat::operator=(pMVar2,&m);
      Mat::~Mat(&m);
      local_190 = (Crop_x86_avx *)CONCAT44(local_190._4_4_,0xffffff9c);
      if ((pMVar2->data == (void *)0x0) || ((long)pMVar2->c * pMVar2->cstep == 0))
      goto LAB_001ac4dd;
    }
    Mat::create(pMVar2,_outw,_outh,_outd,_outc / 4,(uVar4 >> 2) << sVar5,4,opt->blob_allocator);
    local_190 = (Crop_x86_avx *)CONCAT44(local_190._4_4_,0xffffff9c);
    if ((pMVar2->data != (void *)0x0) && (uVar4 = (ulong)pMVar2->c, pMVar2->cstep * uVar4 != 0)) {
      local_190 = (Crop_x86_avx *)((ulong)local_190._4_4_ << 0x20);
      for (iVar3 = 0; iVar3 < (int)uVar4; iVar3 = iVar3 + 1) {
        for (iVar6 = 0; iVar6 < _outd; iVar6 = iVar6 + 1) {
          Mat::channel(&borderm,&bottom_blob_unpacked,iVar3);
          Mat::depth(&m,&borderm,_doffset + iVar6);
          Mat::~Mat(&borderm);
          Mat::channel(&local_78,local_160,iVar3);
          Mat::depth(&borderm,&local_78,iVar6);
          Mat::~Mat(&local_78);
          crop_pack4_sse(&m,&borderm,_hoffset,_woffset);
          Mat::~Mat(&borderm);
          Mat::~Mat(&m);
        }
        uVar4 = (ulong)(uint)local_160->c;
      }
    }
LAB_001ac4dd:
    Mat::~Mat(&bottom_blob_unpacked);
    goto LAB_001ac4e7;
  }
LAB_001abca8:
  local_190 = (Crop_x86_avx *)0x0;
LAB_001ac4e7:
  return (int)local_190;
}

Assistant:

int Crop_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}